

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9HashmapWalk(jx9_hashmap *pMap,_func_int_jx9_value_ptr_jx9_value_ptr_void_ptr *xWalk,
                    void *pUserData)

{
  jx9_hashmap_node *pNode;
  int iVar1;
  sxu32 sVar2;
  jx9_hashmap_node **ppjVar3;
  jx9_value sValue;
  jx9_value sKey;
  anon_union_8_3_18420de5_for_x local_b8;
  undefined8 uStack_b0;
  jx9_vm *local_a8;
  jx9_vm *pjStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a8 = pMap->pVm;
  uStack_40 = 0;
  local_78.rVal = 0.0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_70 = 0x20;
  uStack_80 = 0;
  local_b8.rVal = 0.0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_b0 = 0x20;
  sVar2 = pMap->nEntry;
  if (sVar2 != 0) {
    ppjVar3 = &pMap->pFirst;
    pjStack_a0 = local_a8;
    local_68 = local_a8;
    pjStack_60 = local_a8;
    do {
      pNode = *ppjVar3;
      jx9HashmapExtractNodeKey(pNode,(jx9_value *)&local_78);
      jx9HashmapExtractNodeValue(pNode,(jx9_value *)&local_b8,0);
      iVar1 = (*xWalk)((jx9_value *)&local_78,(jx9_value *)&local_b8,pUserData);
      jx9MemObjRelease((jx9_value *)&local_78);
      jx9MemObjRelease((jx9_value *)&local_b8);
      if (iVar1 != 0) {
        return -10;
      }
      ppjVar3 = &pNode->pPrev;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapWalk(
	jx9_hashmap *pMap, /* Target hashmap */
	int (*xWalk)(jx9_value *, jx9_value *, void *), /* Walker callback */
	void *pUserData /* Last argument to xWalk() */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sKey, sValue;
	sxi32 rc;
	sxu32 n;
	/* Initialize walker parameter */
	rc = SXRET_OK;
	jx9MemObjInit(pMap->pVm, &sKey);
	jx9MemObjInit(pMap->pVm, &sValue);
	n = pMap->nEntry;
	pEntry = pMap->pFirst;
	/* Start the iteration process */
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract a copy of the key and a copy the current value */
		jx9HashmapExtractNodeKey(pEntry, &sKey);
		jx9HashmapExtractNodeValue(pEntry, &sValue, FALSE);
		/* Invoke the user callback */
		rc = xWalk(&sKey, &sValue, pUserData);
		/* Release the copy of the key and the value */
		jx9MemObjRelease(&sKey);
		jx9MemObjRelease(&sValue);
		if( rc != JX9_OK ){
			/* Callback request an operation abort */
			return SXERR_ABORT;
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* All done */
	return SXRET_OK;
}